

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_gen.cc
# Opt level: O1

int cbs_str_equal(CBS *cbs,char *str)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  size_t __n;
  
  sVar1 = cbs->len;
  __n = strlen(str);
  uVar2 = 0;
  if (sVar1 == __n) {
    if (__n == 0) {
      uVar2 = 1;
    }
    else {
      iVar3 = bcmp(cbs->data,str,__n);
      uVar2 = (uint)(iVar3 == 0);
    }
  }
  return uVar2;
}

Assistant:

static int cbs_str_equal(const CBS *cbs, const char *str) {
  return CBS_len(cbs) == strlen(str) &&
         OPENSSL_memcmp(CBS_data(cbs), str, strlen(str)) == 0;
}